

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void set_color_sensitivity
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int y_sad,uint source_variance,
               buf_2d *yv12_mb)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int subsampling_x_00;
  int subsampling_y_00;
  int iVar3;
  bool bVar4;
  sbyte sVar5;
  BLOCK_SIZE BVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int in_ECX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long *in_RDI;
  uint in_R8D;
  long in_R9;
  int norm_uv_sad;
  int uv_sad;
  BLOCK_SIZE bs;
  macroblock_plane *p;
  int plane;
  int num_planes;
  uint thresh_spatial;
  int norm_sad;
  NOISE_LEVEL noise_level;
  int norm_uv_sad_thresh2;
  int norm_uv_sad_thresh;
  uint source_var_thr;
  int shift;
  int high_res;
  int source_sad_nonrd;
  int subsampling_y;
  int subsampling_x;
  bool local_75;
  int local_5c;
  NOISE_LEVEL local_4c;
  int local_48;
  int local_44;
  uint local_40;
  
  subsampling_x_00 = *(int *)(in_RDI[0x8401] + 0x60);
  subsampling_y_00 = *(int *)(in_RDI[0x8401] + 100);
  iVar3 = *(int *)(in_RSI + 0x15d60);
  bVar4 = 0x383ff < (int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc);
  if ((in_DL == *(BLOCK_SIZE *)(in_RDI[0x8401] + 0x1c)) && (*(int *)(in_RSI + 0x25634) == 0)) {
    if (*(char *)(in_RSI + 0x25626) == '\x02') {
      *(bool *)(in_RSI + 0x25626) = 2 < iVar3;
    }
    if (*(char *)(in_RSI + 0x25627) == '\x02') {
      *(bool *)(in_RSI + 0x25627) = 2 < iVar3;
    }
  }
  else {
    sVar5 = 3;
    local_40 = 0x32;
    local_44 = 100;
    local_48 = 0x28;
    if ((2 < iVar3) && ((*(int *)(in_RSI + 0x25640) != 0 && (bVar4)))) {
      sVar5 = 4;
    }
    if (*(int *)((long)in_RDI + 0x4269c) == 1) {
      if ((int)in_RDI[0xc0f6] != 0) {
        sVar5 = 6;
      }
      if (3 < iVar3) {
        local_40 = 0x4b0;
        local_44 = 10;
      }
      if (((0x5a < (int)in_RDI[0xc10a]) && (10000 < (ulong)in_RDI[0xc0f9])) && (2 < iVar3)) {
        sVar5 = 10;
        local_44 = 0;
        local_48 = 0;
      }
    }
    local_4c = kLow;
    uVar1 = ""[in_DL];
    uVar2 = ""[in_DL];
    uVar7 = 1000;
    if (0x780 < (int)in_RDI[0x77f7]) {
      uVar7 = 5000;
    }
    if ((int)in_RDI[0x13a9c] != 0) {
      local_4c = av1_noise_estimate_extract_level((NOISE_ESTIMATE *)(in_RDI + 0x13a9c));
    }
    if (((local_4c == kLow) && (uVar7 < in_R8D)) &&
       ((*(int *)((long)in_RDI + 0x4269c) != 1 && (in_ECX >> (uVar1 + uVar2 & 0x1f) < 0x32)))) {
      *(undefined1 *)(in_RSI + 0x25626) = 0;
      *(undefined1 *)(in_RSI + 0x25627) = 0;
    }
    else {
      iVar8 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x77f0));
      for (local_5c = 1; local_5c < iVar8; local_5c = local_5c + 1) {
        if (((*(char *)(in_RSI + 0x25626 + (long)(local_5c + -1)) == '\x02') ||
            (*(int *)(in_RSI + 0x25634) != 0)) ||
           ((*(char *)(in_RSI + 0x25626 + (long)(local_5c + -1)) == '\0' && ((2 < iVar3 && (bVar4)))
            ))) {
          lVar11 = in_RSI + (long)local_5c * 0x88;
          BVar6 = get_plane_block_size(in_DL,subsampling_x_00,subsampling_y_00);
          iVar9 = (**(code **)(*in_RDI + 0xc900 + (ulong)BVar6 * 0x70))
                            (*(undefined8 *)(lVar11 + 0x30),*(undefined4 *)(lVar11 + 0x48),
                             *(undefined8 *)(in_R9 + (long)local_5c * 0x20),
                             *(undefined4 *)(in_R9 + (long)local_5c * 0x20 + 0x18));
          iVar10 = iVar9 >> (""[BVar6] + ""[BVar6] & 0x1f);
          local_75 = in_ECX >> sVar5 < iVar9 && local_48 < iVar10;
          *(bool *)(in_RSI + 0x25626 + (long)(local_5c + -1)) = local_75;
          if ((in_R8D < local_40) && (local_44 < iVar10)) {
            *(undefined1 *)(in_RSI + 0x25626 + (long)(local_5c + -1)) = 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void set_color_sensitivity(AV1_COMP *cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, int y_sad,
                                  unsigned int source_variance,
                                  struct buf_2d yv12_mb[MAX_MB_PLANE]) {
  const int subsampling_x = cpi->common.seq_params->subsampling_x;
  const int subsampling_y = cpi->common.seq_params->subsampling_y;
  const int source_sad_nonrd = x->content_state_sb.source_sad_nonrd;
  const int high_res = cpi->common.width * cpi->common.height >= 640 * 360;
  if (bsize == cpi->common.seq_params->sb_size &&
      !x->force_color_check_block_level) {
    // At superblock level color_sensitivity is already set to 0, 1, or 2.
    // 2 is middle/uncertain level. To avoid additional sad
    // computations when bsize = sb_size force level 2 to 1 (certain color)
    // for motion areas. Avoid this shortcut if x->force_color_check_block_level
    // is set.
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 2) {
      x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] =
          source_sad_nonrd >= kMedSad ? 1 : 0;
    }
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 2) {
      x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] =
          source_sad_nonrd >= kMedSad ? 1 : 0;
    }
    return;
  }
  // Divide factor for comparing uv_sad to y_sad.
  int shift = 3;
  // Threshold for the block spatial source variance.
  unsigned int source_var_thr = 50;
  // Thresholds for normalized uv_sad, the first one is used for
  // low source_varaince.
  int norm_uv_sad_thresh = 100;
  int norm_uv_sad_thresh2 = 40;
  if (source_sad_nonrd >= kMedSad && x->source_variance > 0 && high_res)
    shift = 4;
  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
    if (cpi->rc.high_source_sad) shift = 6;
    if (source_sad_nonrd > kMedSad) {
      source_var_thr = 1200;
      norm_uv_sad_thresh = 10;
    }
    if (cpi->rc.percent_blocks_with_motion > 90 &&
        cpi->rc.frame_source_sad > 10000 && source_sad_nonrd > kLowSad) {
      // Aggressive setting for color_sensitivity for this content.
      shift = 10;
      norm_uv_sad_thresh = 0;
      norm_uv_sad_thresh2 = 0;
    }
  }
  NOISE_LEVEL noise_level = kLow;
  int norm_sad =
      y_sad >> (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);
  unsigned int thresh_spatial = (cpi->common.width > 1920) ? 5000 : 1000;
  // If the spatial source variance is high and the normalized y_sad
  // is low, then y-channel is likely good for mode estimation, so keep
  // color_sensitivity off. For low noise content for now, since there is
  // some bdrate regression for noisy color clip.
  if (cpi->noise_estimate.enabled)
    noise_level = av1_noise_estimate_extract_level(&cpi->noise_estimate);
  if (noise_level == kLow && source_variance > thresh_spatial &&
      cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN && norm_sad < 50) {
    x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] = 0;
    x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] = 0;
    return;
  }
  const int num_planes = av1_num_planes(&cpi->common);

  for (int plane = AOM_PLANE_U; plane < num_planes; ++plane) {
    // Always check if level = 2. If level = 0 check again for
    // motion areas for higher resolns, where color artifacts
    // are more noticeable. Always check if
    // x->force_color_check_block_level is set.
    if (x->color_sensitivity[COLOR_SENS_IDX(plane)] == 2 ||
        x->force_color_check_block_level ||
        (x->color_sensitivity[COLOR_SENS_IDX(plane)] == 0 &&
         source_sad_nonrd >= kMedSad && high_res)) {
      struct macroblock_plane *const p = &x->plane[plane];
      const BLOCK_SIZE bs =
          get_plane_block_size(bsize, subsampling_x, subsampling_y);

      const int uv_sad = cpi->ppi->fn_ptr[bs].sdf(
          p->src.buf, p->src.stride, yv12_mb[plane].buf, yv12_mb[plane].stride);

      const int norm_uv_sad =
          uv_sad >> (b_width_log2_lookup[bs] + b_height_log2_lookup[bs]);
      x->color_sensitivity[COLOR_SENS_IDX(plane)] =
          uv_sad > (y_sad >> shift) && norm_uv_sad > norm_uv_sad_thresh2;
      if (source_variance < source_var_thr && norm_uv_sad > norm_uv_sad_thresh)
        x->color_sensitivity[COLOR_SENS_IDX(plane)] = 1;
    }
  }
}